

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Interaction * __thiscall
pbrt::Transform::ApplyInverse(Interaction *__return_storage_ptr__,Transform *this,Interaction *in)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Transform t;
  Transform local_98;
  
  __return_storage_ptr__->mediumInterface = (MediumInterface *)0x0;
  (__return_storage_ptr__->medium).
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  local_98.m.m[0]._0_8_ = *(undefined8 *)(this->mInv).m[0];
  local_98.m.m[0]._8_8_ = *(undefined8 *)((this->mInv).m[0] + 2);
  local_98.m.m[1]._0_8_ = *(undefined8 *)(this->mInv).m[1];
  local_98.m.m[1]._8_8_ = *(undefined8 *)((this->mInv).m[1] + 2);
  local_98.m.m[2]._0_8_ = *(undefined8 *)(this->mInv).m[2];
  local_98.m.m[2]._8_8_ = *(undefined8 *)((this->mInv).m[2] + 2);
  local_98.m.m[3]._0_8_ = *(undefined8 *)(this->mInv).m[3];
  local_98.m.m[3]._8_8_ = *(undefined8 *)((this->mInv).m[3] + 2);
  local_98.mInv.m[0]._0_8_ = *(undefined8 *)(this->m).m[0];
  local_98.mInv.m[0]._8_8_ = *(undefined8 *)((this->m).m[0] + 2);
  local_98.mInv.m[1]._0_8_ = *(undefined8 *)(this->m).m[1];
  local_98.mInv.m[1]._8_8_ = *(undefined8 *)((this->m).m[1] + 2);
  local_98.mInv.m[2]._0_8_ = *(undefined8 *)(this->m).m[2];
  local_98.mInv.m[2]._8_8_ = *(undefined8 *)((this->m).m[2] + 2);
  local_98.mInv.m[3]._0_8_ = *(undefined8 *)(this->m).m[3];
  local_98.mInv.m[3]._8_8_ = *(undefined8 *)((this->m).m[3] + 2);
  operator()(&__return_storage_ptr__->pi,&local_98,&in->pi);
  __return_storage_ptr__->time = 0.0;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z = 0;
  (__return_storage_ptr__->uv).super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  fVar3 = (in->n).super_Tuple3<pbrt::Normal3,_float>.y;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = local_98.mInv.m[0][0];
  auVar5._4_4_ = local_98.mInv.m[0][1];
  auVar11._8_8_ = 0;
  auVar11._0_4_ = local_98.mInv.m[2][0];
  auVar11._4_4_ = local_98.mInv.m[2][1];
  auVar12._0_4_ = fVar3 * local_98.mInv.m[1][0];
  auVar12._4_4_ = fVar3 * local_98.mInv.m[1][1];
  auVar12._8_4_ = fVar3 * 0.0;
  auVar12._12_4_ = fVar3 * 0.0;
  fVar10 = (in->n).super_Tuple3<pbrt::Normal3,_float>.x;
  auVar9._4_4_ = fVar10;
  auVar9._0_4_ = fVar10;
  auVar9._8_4_ = fVar10;
  auVar9._12_4_ = fVar10;
  auVar4 = vfmadd231ps_fma(auVar12,auVar9,auVar5);
  fVar10 = (in->n).super_Tuple3<pbrt::Normal3,_float>.z;
  auVar6._4_4_ = fVar10;
  auVar6._0_4_ = fVar10;
  auVar6._8_4_ = fVar10;
  auVar6._12_4_ = fVar10;
  auVar5 = vfmadd231ps_fma(auVar4,auVar6,auVar11);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * local_98.mInv.m[1][2])),auVar9,
                           ZEXT416((uint)local_98.mInv.m[0][2]));
  auVar6 = vfmadd231ss_fma(auVar4,auVar6,ZEXT416((uint)local_98.mInv.m[2][2]));
  uVar2 = vmovlps_avx(auVar5);
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  auVar4._0_4_ = auVar5._0_4_ * auVar5._0_4_;
  auVar4._4_4_ = auVar5._4_4_ * auVar5._4_4_;
  auVar4._8_4_ = auVar5._8_4_ * auVar5._8_4_;
  auVar4._12_4_ = auVar5._12_4_ * auVar5._12_4_;
  auVar4 = vhaddps_avx(auVar4,auVar4);
  fVar10 = auVar6._0_4_;
  (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z = fVar10;
  fVar3 = auVar4._0_4_ + fVar10 * fVar10;
  if (0.0 < fVar3) {
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      auVar4 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
      fVar3 = auVar4._0_4_;
    }
    auVar7._4_4_ = fVar3;
    auVar7._0_4_ = fVar3;
    auVar7._8_4_ = fVar3;
    auVar7._12_4_ = fVar3;
    auVar4 = vdivps_avx(auVar5,auVar7);
    uVar2 = vmovlps_avx(auVar4);
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    (__return_storage_ptr__->n).super_Tuple3<pbrt::Normal3,_float>.z = fVar10 / fVar3;
  }
  (__return_storage_ptr__->uv).super_Tuple2<pbrt::Point2,_float> =
       (in->uv).super_Tuple2<pbrt::Point2,_float>;
  fVar3 = (in->wo).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar10 = (in->wo).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (in->wo).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_98.m.m[0][1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)local_98.m.m[0][0]));
  auVar5 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.m.m[0][2]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_98.m.m[1][1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)local_98.m.m[1][0]));
  auVar6 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.m.m[1][2]));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_98.m.m[2][1])),ZEXT416((uint)fVar3),
                           ZEXT416((uint)local_98.m.m[2][0]));
  auVar9 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar1),ZEXT416((uint)local_98.m.m[2][2]));
  auVar4 = vinsertps_avx(auVar5,auVar6,0x10);
  uVar2 = vmovlps_avx(auVar4);
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = auVar9._0_4_;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * auVar6._0_4_)),auVar5,auVar5);
  auVar5 = vfmadd231ss_fma(auVar5,auVar9,auVar9);
  fVar3 = auVar5._0_4_;
  if (0.0 < fVar3) {
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
      auVar9 = ZEXT416((uint)auVar9._0_4_);
    }
    else {
      auVar5 = vsqrtss_avx(auVar5,auVar5);
      fVar3 = auVar5._0_4_;
    }
    auVar8._4_4_ = fVar3;
    auVar8._0_4_ = fVar3;
    auVar8._8_4_ = fVar3;
    auVar8._12_4_ = fVar3;
    auVar4 = vdivps_avx(auVar4,auVar8);
    uVar2 = vmovlps_avx(auVar4);
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar2 >> 0x20);
    (__return_storage_ptr__->wo).super_Tuple3<pbrt::Vector3,_float>.z = auVar9._0_4_ / fVar3;
  }
  __return_storage_ptr__->time = in->time;
  __return_storage_ptr__->mediumInterface = in->mediumInterface;
  return __return_storage_ptr__;
}

Assistant:

Interaction Transform::ApplyInverse(const Interaction &in) const {
    Interaction ret;
    Transform t = Inverse(*this);
    ret.pi = t(in.pi);
    ret.n = t(in.n);
    if (LengthSquared(ret.n) > 0)
        ret.n = Normalize(ret.n);
    ret.uv = in.uv;
    ret.wo = t(in.wo);
    if (LengthSquared(ret.wo) > 0)
        ret.wo = Normalize(ret.wo);
    ret.time = in.time;
    ret.mediumInterface = in.mediumInterface;
    return ret;
}